

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cte.cpp
# Opt level: O1

void __thiscall duckdb::CTELocalState::~CTELocalState(CTELocalState *this)

{
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var1;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__CTELocalState_024ab058;
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::~vector
            (&(this->append_state).vector_data.
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
            );
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->append_state);
  ColumnDataCollection::~ColumnDataCollection(&this->lhs_data);
  _Var1._M_head_impl =
       (this->distinct_state).
       super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
       super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
       .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (LocalSinkState *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_LocalSinkState + 8))();
  }
  (this->distinct_state).
  super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>.
  super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_02497200;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

explicit CTELocalState(ClientContext &context, const PhysicalCTE &op)
	    : lhs_data(context, op.working_table->Types()) {
		lhs_data.InitializeAppend(append_state);
	}